

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O0

void __thiscall adjMaxtrix<char>::print(adjMaxtrix<char> *this)

{
  _Setw _Var1;
  size_type sVar2;
  ostream *poVar3;
  int local_18;
  int local_14;
  int j;
  int i;
  adjMaxtrix<char> *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar2 = std::vector<char,_std::allocator<char>_>::size(&this->vexs);
    if (sVar2 <= (ulong)(long)local_14) break;
    local_18 = 0;
    while( true ) {
      sVar2 = std::vector<char,_std::allocator<char>_>::size(&this->vexs);
      if (sVar2 <= (ulong)(long)local_18) break;
      _Var1 = std::setw(6);
      poVar3 = std::operator<<((ostream *)&std::cout,_Var1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->edge[local_14][local_18]);
      std::operator<<(poVar3," ");
      local_18 = local_18 + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void adjMaxtrix<dataType>::print() {
	for (int i = 0; i < vexs.size(); i++) {
		for (int j = 0; j < vexs.size(); j++) {
			cout << setw(6) << edge[i][j] << " ";
		}
		cout << endl;
	}
}